

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_world.cpp
# Opt level: O3

void __thiscall RandomizerWorld::load_nodes(RandomizerWorld *this)

{
  pointer ppIVar1;
  ItemSource *pIVar2;
  bool bVar3;
  string_type *id;
  reference json;
  WorldNode *pWVar4;
  mapped_type *ppWVar5;
  pointer ppIVar6;
  iterator result_1;
  Json nodes_json;
  iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  __begin1;
  iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  __end1;
  ItemSource *local_190;
  iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_188 [2];
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_148;
  _Any_data local_138;
  code *local_128;
  undefined8 uStack_120;
  iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_110;
  iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_a0;
  
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_128 = (code *)0x0;
  uStack_120 = 0;
  nlohmann::
  basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<unsigned_char_const(&)[10143]>
            ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_148,
             (uchar (*) [10143])
             "{\n    \"massan\": {\n        \"name\": \"Massan\",\n        \"hints\": [\n            \"in a village\",\n            \"in a region inhabited by bears\",\n            \"in the village of Massan\"\n        ]\n    },\n    \"massan_cave\": {\n        \"name\": \"Massan Cave\",\n        \"hints\": [\n            \"in a large cave\",\n            \"in a region inhabited by bears\",\n            \"in Massan cave\"\n        ]\n    },\n    \"route_massan_gumi\": {\n        \"name\": \"Route between Massan and Gumi\",\n        \"hints\": [\n            \"on a route\",\n            \"in a region inhabited by bears\",\n            \"between Massan and Gumi\"\n        ]\n    },\n    \"waterfall_shrine\": {\n        \"name\": \"Waterfall Shrine\",\n        \"hints\": [\n            \"in a shrine\",\n            \"close to a waterfall\",\n            \"in a region inhabited by bears\",\n            \"in Waterfall Shrine\"\n        ]\n    },\n    \"swamp_shrine\": {\n        \"name\": \"Swamp Shrine\",\n        \"hints\": [\n            \"in a shrine\",\n            \"near a swamp\",\n            \"in a region inhabited by bears\",\n            \"in Swamp Shrine\"\n        ]\n    },\n    \"massan_after_swamp_shrine\": {\n        \"name\": \"Massan (after Swamp Shrine)\",\n        \"hints\": [\n            \"in a village\",\n            \"in a region inhabited by bears\",\n            \"in the village of Massan\"\n        ]\n    },\n    \"gumi_after_swamp_shrine\": {\n        \"name\": \"Gumi (after Swamp Shrine)\",\n        \"hints\": [\n            \"in a village\",\n            \"in a region inhabited by bears\",\n            \"in the village of Gumi\"\n        ]\n    },\n    \"gumi\": {\n        \"name\": \"Gumi\",\n        \"hints\": [\n            \"in a village\",\n            \"in a region inhabited by bears\",\n            \"in the village of Gumi\"\n        ]\n    },\n    \"route_gumi_ryuma\": {\n        \"name\": \"Route from Gumi to Ryuma\",\n        \"hints\": [\n            \"on a route\",\n            \"in a region inhabited by bears\",\n            \"between Gumi and Ryuma\"\n        ]\n    },\n    \"tibor\": {\n        \"name\": \"Tibor\",\n        \"hints\": [\n            \"among the trees\",\n            \"inside the elder t..." /* TRUNCATED STRING LITERAL */
             ,(parser_callback_t *)&local_138,true,false);
  if (local_128 != (code *)0x0) {
    (*local_128)(&local_138,&local_138,__destroy_functor);
  }
  local_a0.anchor.m_it.object_iterator._M_current =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        *)0x0;
  local_a0.anchor.m_it.array_iterator._M_current =
       (basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        *)0x0;
  local_a0.anchor.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_a0.anchor.m_object = &local_148;
  nlohmann::detail::
  iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::set_begin(&local_a0.anchor);
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::iteration_proxy_value(&local_110,&local_a0.anchor);
  local_188[0].m_it.object_iterator._M_current =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        *)0x0;
  local_188[0].m_it.array_iterator._M_current =
       (basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        *)0x0;
  local_188[0].m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_188[0].m_object = &local_148;
  nlohmann::detail::
  iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::set_end(local_188);
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::iteration_proxy_value(&local_a0,local_188);
  while( true ) {
    bVar3 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator==<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&local_110.anchor,&local_a0.anchor);
    if (bVar3) break;
    id = nlohmann::detail::
         iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ::key(&local_110);
    json = nlohmann::detail::
           iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::operator*(&local_110.anchor);
    pWVar4 = WorldNode::from_json(id,json);
    ppWVar5 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
              ::operator[](&this->_nodes,id);
    *ppWVar5 = pWVar4;
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++(&local_110.anchor);
    local_110.array_index = local_110.array_index + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.empty_str._M_dataplus._M_p != &local_a0.empty_str.field_2) {
    operator_delete(local_a0.empty_str._M_dataplus._M_p,
                    local_a0.empty_str.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.array_index_str._M_dataplus._M_p != &local_a0.array_index_str.field_2) {
    operator_delete(local_a0.array_index_str._M_dataplus._M_p,
                    local_a0.array_index_str.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.empty_str._M_dataplus._M_p != &local_110.empty_str.field_2) {
    operator_delete(local_110.empty_str._M_dataplus._M_p,
                    local_110.empty_str.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.array_index_str._M_dataplus._M_p != &local_110.array_index_str.field_2) {
    operator_delete(local_110.array_index_str._M_dataplus._M_p,
                    local_110.array_index_str.field_2._M_allocated_capacity + 1);
  }
  ppIVar6 = (this->_item_sources).super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppIVar1 = (this->_item_sources).super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppIVar6 != ppIVar1) {
    do {
      pIVar2 = *ppIVar6;
      ppWVar5 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
                ::at(&this->_nodes,&pIVar2->_node_id);
      local_190 = pIVar2;
      std::vector<ItemSource*,std::allocator<ItemSource*>>::emplace_back<ItemSource*&>
                ((vector<ItemSource*,std::allocator<ItemSource*>> *)&(*ppWVar5)->_item_sources,
                 &local_190);
      ppIVar6 = ppIVar6 + 1;
    } while (ppIVar6 != ppIVar1);
  }
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_148);
  return;
}

Assistant:

void RandomizerWorld::load_nodes()
{
    Json nodes_json = Json::parse(WORLD_NODES_JSON);
    for(auto& [node_id, node_json] : nodes_json.items())
    {
        WorldNode* new_node = WorldNode::from_json(node_id, node_json);
        _nodes[node_id] = new_node;
    }

    for(ItemSource* source : this->item_sources())
    {
        const std::string& node_id = source->node_id();
        try {
            _nodes.at(node_id)->add_item_source(source);
        } catch(std::out_of_range&) {
            throw LandstalkerException("Could not find node '" + node_id + "' referenced by item source '" + source->name() + "'");
        }
    }
}